

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlReaderNewFd(xmlTextReaderPtr reader,int fd,char *URL,char *encoding,int options)

{
  int iVar1;
  xmlParserInputBufferPtr input;
  
  if (reader != (xmlTextReaderPtr)0x0 && -1 < fd) {
    input = xmlParserInputBufferCreateFd(fd,XML_CHAR_ENCODING_NONE);
    if (input != (xmlParserInputBufferPtr)0x0) {
      input->closecallback = (xmlInputCloseCallback)0x0;
      iVar1 = xmlTextReaderSetup(reader,input,URL,encoding,options);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int
xmlReaderNewFd(xmlTextReaderPtr reader, int fd,
               const char *URL, const char *encoding, int options)
{
    xmlParserInputBufferPtr input;

    if (fd < 0)
        return (-1);
    if (reader == NULL)
        return (-1);

    input = xmlParserInputBufferCreateFd(fd, XML_CHAR_ENCODING_NONE);
    if (input == NULL)
        return (-1);
    input->closecallback = NULL;
    return (xmlTextReaderSetup(reader, input, URL, encoding, options));
}